

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaTargetGenerator::ExportObjectCompileCommand
          (cmNinjaTargetGenerator *this,string *language,string *sourceFileName,string *objectDir,
          string *objectFileName,string *objectFileDir,string *flags,string *defines,
          string *includes)

{
  pointer *this_00;
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  cmGlobalNinjaGenerator *pcVar5;
  cmake *this_01;
  cmMakefile *pcVar6;
  cmLocalNinjaGenerator *pcVar7;
  undefined4 extraout_var;
  cmRulePlaceholderExpander *this_02;
  reference s;
  cmOutputConverter *local_4a0;
  undefined1 local_3a8 [8];
  string cmdLine;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_380;
  iterator i;
  auto_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander;
  undefined1 local_368 [8];
  string compileCmd_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  undefined1 local_300 [8];
  string cmdVar_1;
  undefined1 local_2d8 [8];
  string compileCmd;
  string local_2b0 [39];
  allocator local_289;
  string local_288 [39];
  allocator local_261;
  string local_260;
  allocator local_239;
  string local_238 [39];
  allocator local_211;
  string local_210;
  undefined1 local_1f0 [8];
  string cmdVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  compileCmds;
  string local_198;
  undefined1 local_178 [8];
  string escapedSourceFileName;
  RuleVariables compileObjectVars;
  allocator local_59;
  string local_58;
  string *local_38;
  string *objectFileDir_local;
  string *objectFileName_local;
  string *objectDir_local;
  string *sourceFileName_local;
  string *language_local;
  cmNinjaTargetGenerator *this_local;
  
  pcVar6 = (this->super_cmCommonTargetGenerator).Makefile;
  local_38 = objectFileDir;
  objectFileDir_local = objectFileName;
  objectFileName_local = objectDir;
  objectDir_local = sourceFileName;
  sourceFileName_local = language;
  language_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"CMAKE_EXPORT_COMPILE_COMMANDS",&local_59);
  bVar2 = cmMakefile::IsOn(pcVar6,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    cmRulePlaceholderExpander::RuleVariables::RuleVariables
              ((RuleVariables *)((long)&escapedSourceFileName.field_2 + 8));
    std::__cxx11::string::c_str();
    std::__cxx11::string::string((string *)local_178,(string *)objectDir_local);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar4);
    if (!bVar2) {
      pcVar5 = GetGlobalGenerator(this);
      this_01 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)pcVar5);
      pcVar4 = cmake::GetHomeOutputDirectory(this_01);
      cmsys::SystemTools::CollapseFullPath(&local_198,(string *)local_178,pcVar4);
      std::__cxx11::string::operator=((string *)local_178,(string *)&local_198);
      std::__cxx11::string::~string((string *)&local_198);
    }
    cmOutputConverter::ConvertToOutputFormat
              ((string *)
               &compileCmds.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,(string *)local_178,SHELL);
    this_00 = &compileCmds.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::operator=((string *)local_178,(string *)this_00);
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&cmdVar.field_2 + 8));
    bVar2 = std::operator==(sourceFileName_local,"CUDA");
    if (bVar2) {
      std::__cxx11::string::string((string *)local_1f0);
      pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_210,"CUDA_SEPARABLE_COMPILATION",&local_211);
      bVar2 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_238,"CMAKE_CUDA_COMPILE_SEPARABLE_COMPILATION",&local_239);
        std::__cxx11::string::operator=((string *)local_1f0,local_238);
        std::__cxx11::string::~string(local_238);
        std::allocator<char>::~allocator((allocator<char> *)&local_239);
      }
      else {
        pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_260,"CUDA_PTX_COMPILATION",&local_261);
        bVar2 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_260);
        std::__cxx11::string::~string((string *)&local_260);
        std::allocator<char>::~allocator((allocator<char> *)&local_261);
        if (bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_288,"CMAKE_CUDA_COMPILE_PTX_COMPILATION",&local_289);
          std::__cxx11::string::operator=((string *)local_1f0,local_288);
          std::__cxx11::string::~string(local_288);
          std::allocator<char>::~allocator((allocator<char> *)&local_289);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_2b0,"CMAKE_CUDA_COMPILE_WHOLE_COMPILATION",
                     (allocator *)(compileCmd.field_2._M_local_buf + 0xf));
          std::__cxx11::string::operator=((string *)local_1f0,local_2b0);
          std::__cxx11::string::~string(local_2b0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(compileCmd.field_2._M_local_buf + 0xf));
        }
      }
      pcVar6 = GetMakefile(this);
      pcVar4 = cmMakefile::GetRequiredDefinition(pcVar6,(string *)local_1f0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_2d8,pcVar4,(allocator *)(cmdVar_1.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(cmdVar_1.field_2._M_local_buf + 0xf));
      cmSystemTools::ExpandListArgument
                ((string *)local_2d8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&cmdVar.field_2 + 8),false);
      std::__cxx11::string::~string((string *)local_2d8);
      std::__cxx11::string::~string((string *)local_1f0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_340,"CMAKE_",
                 (allocator *)(compileCmd_1.field_2._M_local_buf + 0xf));
      std::operator+(&local_320,&local_340,sourceFileName_local);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300,
                     &local_320,"_COMPILE_OBJECT");
      std::__cxx11::string::~string((string *)&local_320);
      std::__cxx11::string::~string((string *)&local_340);
      std::allocator<char>::~allocator((allocator<char> *)(compileCmd_1.field_2._M_local_buf + 0xf))
      ;
      pcVar6 = GetMakefile(this);
      pcVar4 = cmMakefile::GetRequiredDefinition(pcVar6,(string *)local_300);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_368,pcVar4,(allocator *)((long)&rulePlaceholderExpander.x_ + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&rulePlaceholderExpander.x_ + 7));
      cmSystemTools::ExpandListArgument
                ((string *)local_368,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&cmdVar.field_2 + 8),false);
      std::__cxx11::string::~string((string *)local_368);
      std::__cxx11::string::~string((string *)local_300);
    }
    pcVar7 = GetLocalGenerator(this);
    iVar3 = (*(pcVar7->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator
              [5])();
    ::cm::auto_ptr<cmRulePlaceholderExpander>::auto_ptr
              ((auto_ptr<cmRulePlaceholderExpander> *)&i,
               (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar3));
    local_380._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&cmdVar.field_2 + 8));
    while( true ) {
      cmdLine.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&cmdVar.field_2 + 8));
      bVar2 = __gnu_cxx::operator!=
                        (&local_380,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&cmdLine.field_2 + 8));
      if (!bVar2) break;
      this_02 = ::cm::auto_ptr<cmRulePlaceholderExpander>::operator->
                          ((auto_ptr<cmRulePlaceholderExpander> *)&i);
      pcVar7 = GetLocalGenerator(this);
      local_4a0 = (cmOutputConverter *)0x0;
      if (pcVar7 != (cmLocalNinjaGenerator *)0x0) {
        local_4a0 = &(pcVar7->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                     super_cmOutputConverter;
      }
      s = __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&local_380);
      cmRulePlaceholderExpander::ExpandRuleVariables
                (this_02,local_4a0,s,(RuleVariables *)((long)&escapedSourceFileName.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_380);
    }
    pcVar7 = GetLocalGenerator(this);
    cmLocalNinjaGenerator::BuildCommandLine
              ((string *)local_3a8,pcVar7,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&cmdVar.field_2 + 8));
    pcVar5 = GetGlobalGenerator(this);
    cmGlobalNinjaGenerator::AddCXXCompileCommand(pcVar5,(string *)local_3a8,objectDir_local);
    std::__cxx11::string::~string((string *)local_3a8);
    ::cm::auto_ptr<cmRulePlaceholderExpander>::~auto_ptr((auto_ptr<cmRulePlaceholderExpander> *)&i);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&cmdVar.field_2 + 8));
    std::__cxx11::string::~string((string *)local_178);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::ExportObjectCompileCommand(
  std::string const& language, std::string const& sourceFileName,
  std::string const& objectDir, std::string const& objectFileName,
  std::string const& objectFileDir, std::string const& flags,
  std::string const& defines, std::string const& includes)
{
  if (!this->Makefile->IsOn("CMAKE_EXPORT_COMPILE_COMMANDS")) {
    return;
  }

  cmRulePlaceholderExpander::RuleVariables compileObjectVars;
  compileObjectVars.Language = language.c_str();

  std::string escapedSourceFileName = sourceFileName;

  if (!cmSystemTools::FileIsFullPath(sourceFileName.c_str())) {
    escapedSourceFileName = cmSystemTools::CollapseFullPath(
      escapedSourceFileName, this->GetGlobalGenerator()
                               ->GetCMakeInstance()
                               ->GetHomeOutputDirectory());
  }

  escapedSourceFileName = this->LocalGenerator->ConvertToOutputFormat(
    escapedSourceFileName, cmOutputConverter::SHELL);

  compileObjectVars.Source = escapedSourceFileName.c_str();
  compileObjectVars.Object = objectFileName.c_str();
  compileObjectVars.ObjectDir = objectDir.c_str();
  compileObjectVars.ObjectFileDir = objectFileDir.c_str();
  compileObjectVars.Flags = flags.c_str();
  compileObjectVars.Defines = defines.c_str();
  compileObjectVars.Includes = includes.c_str();

  // Rule for compiling object file.
  std::vector<std::string> compileCmds;
  if (language == "CUDA") {
    std::string cmdVar;
    if (this->GeneratorTarget->GetPropertyAsBool(
          "CUDA_SEPARABLE_COMPILATION")) {
      cmdVar = std::string("CMAKE_CUDA_COMPILE_SEPARABLE_COMPILATION");
    } else if (this->GeneratorTarget->GetPropertyAsBool(
                 "CUDA_PTX_COMPILATION")) {
      cmdVar = std::string("CMAKE_CUDA_COMPILE_PTX_COMPILATION");
    } else {
      cmdVar = std::string("CMAKE_CUDA_COMPILE_WHOLE_COMPILATION");
    }
    std::string compileCmd =
      this->GetMakefile()->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  } else {
    const std::string cmdVar =
      std::string("CMAKE_") + language + "_COMPILE_OBJECT";
    std::string compileCmd =
      this->GetMakefile()->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  }

  CM_AUTO_PTR<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->GetLocalGenerator()->CreateRulePlaceholderExpander());

  for (std::vector<std::string>::iterator i = compileCmds.begin();
       i != compileCmds.end(); ++i) {
    // no launcher for CMAKE_EXPORT_COMPILE_COMMANDS
    rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(), *i,
                                                 compileObjectVars);
  }

  std::string cmdLine =
    this->GetLocalGenerator()->BuildCommandLine(compileCmds);

  this->GetGlobalGenerator()->AddCXXCompileCommand(cmdLine, sourceFileName);
}